

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O3

void pty_real_select_result(Pty *pty,int fd,int event,int status)

{
  int iVar1;
  Backend *pBVar2;
  _Bool _Var3;
  int iVar4;
  __pid_t _Var5;
  uint uVar6;
  int extraout_EAX;
  ssize_t sVar7;
  int *piVar8;
  size_t sVar9;
  Pty *pty_00;
  long lVar10;
  Conf *pCVar11;
  PtyFd *pPVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  size_t sVar16;
  undefined4 in_register_0000000c;
  undefined8 uVar17;
  char **ppcVar18;
  Conf *oldconf;
  char *pcVar19;
  uint uVar20;
  PtyFd *e;
  undefined8 *puVar21;
  Seat *pSVar22;
  undefined8 *puVar23;
  ulong in_R8;
  uint in_R9D;
  char cVar24;
  ulong uVar25;
  long *plVar26;
  bool bVar27;
  byte bVar28;
  char buf [4096];
  undefined8 auStackY_15f0 [161];
  undefined4 uStackY_10e8;
  Backend *pBStackY_10d8;
  PtyFd *pPStackY_10d0;
  char *pcStackY_10c8;
  uint uStackY_10bc;
  ulong uStackY_10b8;
  int *piStackY_10b0;
  Seat *pSStackY_10a8;
  char **ppcStackY_10a0;
  termios tStackY_1094;
  Pty *pPStackY_1058;
  undefined1 auStackY_1028 [4];
  int in_stack_ffffffffffffefdc;
  undefined8 auStack_1020 [161];
  undefined4 uStack_b18;
  char *pcStack_b10;
  undefined8 *puStack_b08;
  
  uVar17 = CONCAT44(in_register_0000000c,status);
  bVar28 = 0;
  if (event < 0) {
    if (((status & 0x7fU) != 0) && ((int)((status & 0x7fU) * 0x1000000 + 0x1000000) < 0x2000000)) {
      return;
    }
    pty->child_dead = true;
    del234(ptys_by_pid,pty);
    pty->exit_code = status;
    if (pty->master_fd < 0) {
      return;
    }
LAB_00111c51:
    if (pty->finished != false) {
      return;
    }
    lVar10 = 0x28;
    do {
      if (-1 < *(int *)((long)pty->pipefds + lVar10 + -0x10)) {
        uxsel_del(in_stack_ffffffffffffefdc);
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x58);
    pty_close(pty);
    pty->finished = true;
    iVar4 = conf_get_int(pty->conf,4);
    if (iVar4 == 2) {
      uVar6 = pty->exit_code;
      if (uVar6 == 0) goto LAB_00111dec;
    }
    else {
      if (iVar4 != 1) goto LAB_00111dec;
      uVar6 = pty->exit_code;
    }
    uVar6 = uVar6 & 0x7f;
    if (uVar6 == 0) {
      pcVar13 = dupprintf("\r\n[pterm: process terminated with exit code %d]\r\n");
    }
    else if ((int)(uVar6 * 0x1000000 + 0x1000000) < 0x2000000) {
      pcVar13 = dupprintf("\r\n[pterm: process terminated]\r\n");
    }
    else {
      pcVar13 = strsignal(uVar6);
      pcVar13 = dupprintf("\r\n[pterm: process terminated on signal %d (%s)]\r\n",(ulong)uVar6,
                          pcVar13);
    }
    pSVar22 = pty->seat;
    sVar16 = strlen(pcVar13);
    (*pSVar22->vt->output)(pSVar22,SEAT_OUTPUT_STDOUT,pcVar13,sVar16);
    safefree(pcVar13);
LAB_00111dec:
    (*pty->seat->vt->eof)(pty->seat);
    (*pty->seat->vt->notify_remote_exit)(pty->seat);
    return;
  }
  if (event == 2) {
    pty_try_write(pty);
    return;
  }
  if (event != 1) {
    return;
  }
  pSVar22 = (Seat *)(ulong)(uint)fd;
  iVar4 = pty->master_o;
  sVar7 = read(fd,auStackY_1028,0x1000);
  bVar27 = pty->master_fd != fd;
  ppcVar18 = (char **)CONCAT71((int7)((ulong)uVar17 >> 8),bVar27);
  uVar6 = (uint)sVar7;
  if (-1 < (int)uVar6 || bVar27) {
    if (uVar6 == 0) goto LAB_00111cff;
    if (-1 < (int)uVar6) {
      sVar9 = (*pty->seat->vt->output)
                        (pty->seat,(uint)(iVar4 != fd),auStackY_1028,(ulong)(uVar6 & 0x7fffffff));
      pty->output_backlog = sVar9;
      pty_uxsel_setup(pty);
      return;
    }
  }
  else {
    piVar8 = __errno_location();
    if (*piVar8 == 5) {
LAB_00111cff:
      uxsel_del(in_stack_ffffffffffffefdc);
      close(fd);
      if (pty->master_fd == fd) {
        pty->master_fd = -1;
      }
      if (pty->master_o == fd) {
        pty->master_o = -1;
      }
      if (pty->master_e == fd) {
        pty->master_e = -1;
      }
      if (iVar4 != fd) {
        return;
      }
      pty_try_wait();
      if (pty->child_dead == false) {
        pty->exit_code = 0;
      }
      goto LAB_00111c51;
    }
  }
  pty_real_select_result_cold_1();
  pPVar12 = (PtyFd *)(ulong)in_R9D;
  cVar24 = (char)in_R9D;
  pSStackY_10a8 = pSVar22;
  pPStackY_1058 = pty;
  (*pSVar22->vt->set_trust_status)(pSVar22,false);
  ppcStackY_10a0 = ppcVar18;
  if (single_pty == (Pty *)0x0) {
    pty_00 = (Pty *)safemalloc(1,0x10d0,0);
    memset(pty_00,0,0x10d0);
    bufchain_init(&pty_00->output_data);
    pty_00->master_fd = -1;
    pty_00->slave_fd = -1;
    pty_stamped_utmp = 0;
  }
  else {
    pty_00 = single_pty;
    if (single_pty->conf != (Conf *)0x0) {
      __assert_fail("pty->conf == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pty.c",
                    0x373,
                    "Backend *pty_backend_create(Seat *, LogContext *, Conf *, char **, const char *, struct ssh_ttymodes, _Bool, const char *, const char *const *)"
                   );
    }
  }
  piVar8 = pty_00->pipefds;
  pty_00->pipefds[0] = -1;
  pty_00->pipefds[1] = -1;
  pty_00->pipefds[2] = -1;
  pty_00->pipefds[3] = -1;
  pty_00->pipefds[4] = -1;
  pty_00->pipefds[5] = -1;
  pPStackY_10d0 = pty_00->fds;
  lVar10 = 0x30;
  do {
    *(undefined4 *)((long)pty_00->pipefds + lVar10 + -0x18) = 0xffffffff;
    *(Pty **)((long)pty_00->pipefds + lVar10 + -0x10) = pty_00;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x60);
  if (pty_signal_pipe[0] < 0) {
    iVar4 = pipe(pty_signal_pipe);
    if (-1 < iVar4) {
      cloexec(pty_signal_pipe[0]);
      cloexec(pty_signal_pipe[1]);
      goto LAB_00111f37;
    }
LAB_00112590:
    uVar6 = (uint)in_R8;
    pty_backend_create_cold_4();
    iVar4 = extraout_EAX;
  }
  else {
LAB_00111f37:
    pty_00->seat = pSStackY_10a8;
    (pty_00->backend).vt = &pty_backend;
    pCVar11 = conf_copy(oldconf);
    pty_00->conf = pCVar11;
    iVar4 = conf_get_int(oldconf,0x7d);
    pty_00->term_width = iVar4;
    iVar4 = conf_get_int(oldconf,0x7e);
    pty_00->term_height = iVar4;
    if (ptyfds == (tree234 *)0x0) {
      ptyfds = newtree234(ptyfd_compare);
    }
    pBStackY_10d8 = &pty_00->backend;
    iVar4 = pty_00->master_fd;
    uStackY_10bc = in_R9D;
    uStackY_10b8 = in_R8;
    piStackY_10b0 = piVar8;
    if (cVar24 == '\0') {
      if (iVar4 < 0) {
        pty_open_master(pty_00);
      }
      if (-1 < pty_utmp_helper_pipe) {
        _Var3 = conf_get_bool(oldconf,0xc4);
        if (_Var3) {
          pcVar13 = (*pty_00->seat->vt->get_x_display)(pty_00->seat);
          pPVar12 = (PtyFd *)strlen(pcVar13);
          if ((uint)pPVar12 < 0x7fffffff) {
            uVar6 = (uint)pPVar12 + 1;
            pPVar12 = (PtyFd *)(ulong)uVar6;
            in_R8 = 0;
            do {
              sVar7 = write(pty_utmp_helper_pipe,pcVar13 + in_R8,(long)(int)(uVar6 - (int)in_R8));
              if ((int)sVar7 < 0) {
                perror("pterm: writing to utmp helper process");
                goto LAB_00112115;
              }
              uVar20 = (int)in_R8 + (int)sVar7;
              in_R8 = (ulong)uVar20;
            } while ((int)uVar20 < (int)uVar6);
          }
        }
        else {
LAB_00112115:
          close(pty_utmp_helper_pipe);
          pty_utmp_helper_pipe = -1;
        }
      }
      iVar4 = pty_00->master_fd;
      pty_00->master_i = iVar4;
      pty_00->master_o = iVar4;
      pty_00->master_e = -1;
      pty_00->fds[0].fd = iVar4;
      e = pPStackY_10d0;
    }
    else {
      if ((-1 < iVar4) && (close(iVar4), -1 < pty_utmp_helper_pipe)) {
        close(pty_utmp_helper_pipe);
        pty_utmp_helper_pipe = -1;
      }
      uVar25 = 0xfffffffffffffffe;
      do {
        iVar4 = pipe(piVar8);
        if (iVar4 < 0) {
          (*pBStackY_10d8->vt->free)(pBStackY_10d8);
          return;
        }
        uVar25 = uVar25 + 2;
        piVar8 = piVar8 + 2;
      } while (uVar25 < 4);
      iVar4 = pty_00->pipefds[1];
      iVar1 = pty_00->pipefds[2];
      pty_00->master_i = iVar4;
      pty_00->fds[0].fd = iVar4;
      pty_00->master_o = iVar1;
      pty_00->fds[1].fd = iVar1;
      iVar4 = pty_00->pipefds[4];
      pty_00->master_e = iVar4;
      pPVar12 = pty_00->fds + 2;
      pty_00->fds[2].fd = iVar4;
      add234(ptyfds,pPStackY_10d0);
      add234(ptyfds,pty_00->fds + 1);
      e = pPVar12;
    }
    cVar24 = (char)pPVar12;
    add234(ptyfds,e);
    if (pty_setup_sigchld_handler_setup == '\0') {
      putty_signal(0x11,sigchld_handler);
      pty_setup_sigchld_handler_setup = '\x01';
    }
    _Var5 = fork();
    piVar8 = piStackY_10b0;
    plVar26 = _environ;
    if (_Var5 < 0) {
      pty_backend_create_cold_3();
    }
    else {
      if (_Var5 != 0) {
        pty_00->child_pid = _Var5;
        pty_00->child_dead = false;
        pty_00->finished = false;
        if (0 < pty_00->slave_fd) {
          close(pty_00->slave_fd);
        }
        if (ptys_by_pid == (tree234 *)0x0) {
          ptys_by_pid = newtree234(pty_compare_by_pid);
        }
        iVar4 = *piVar8;
        if (-1 < iVar4) {
          close(iVar4);
          *piVar8 = -1;
        }
        if (-1 < pty_00->pipefds[3]) {
          close(pty_00->pipefds[3]);
          pty_00->pipefds[3] = -1;
        }
        if (-1 < pty_00->pipefds[5]) {
          close(pty_00->pipefds[5]);
          pty_00->pipefds[5] = -1;
        }
        add234(ptys_by_pid,pty_00);
        pty_uxsel_setup(pty_00);
        return;
      }
      if ((pty_osx_envrestore_prefix != (char *)0x0) &&
         (pcVar13 = (char *)*_environ, pcVar13 != (char *)0x0)) {
        sVar16 = strlen(pty_osx_envrestore_prefix);
        pBStackY_10d8 = (Backend *)(long)(int)sVar16;
        pcVar14 = pty_osx_envrestore_prefix;
        do {
          while( true ) {
            iVar4 = strncmp(pcVar13,pcVar14,(size_t)pBStackY_10d8);
            pBVar2 = pBStackY_10d8;
            if (iVar4 == 0) break;
            pcVar13 = (char *)plVar26[1];
            plVar26 = plVar26 + 1;
            if (pcVar13 == (char *)0x0) goto LAB_0011225c;
          }
          pPStackY_10d0 = (PtyFd *)CONCAT71(pPStackY_10d0._1_7_,pcVar13[(long)pBStackY_10d8]);
          sVar16 = strcspn(pcVar13,"=");
          pcVar14 = dupprintf("%.*s",sVar16 & 0xffffffff,pcVar13);
          sVar16 = strcspn(pcVar13,"=");
          pcVar13 = dupstr(pcVar13 + ((sVar16 + 1) - (ulong)(pcVar13[sVar16] == '\0')));
          if ((char)pPStackY_10d0 == 'u') {
            unsetenv(pcVar14 + (long)pBVar2 + 1);
          }
          else {
            setenv(pcVar14 + (long)pBVar2 + 1,pcVar13,1);
          }
          unsetenv(pcVar14);
          safefree(pcVar14);
          safefree(pcVar13);
          pcVar13 = (char *)*_environ;
          plVar26 = _environ;
          pcVar14 = pty_osx_envrestore_prefix;
        } while (pcVar13 != (char *)0x0);
      }
LAB_0011225c:
      uVar6 = getpid();
      in_R8 = (ulong)uVar6;
      cVar24 = (char)uStackY_10bc;
      if ((char)uStackY_10bc != '\0') {
        pty_backend_create_cold_2();
        goto LAB_00112286;
      }
    }
    uVar6 = (uint)in_R8;
    iVar4 = pty_open_slave(pty_00);
    if (iVar4 < 0) {
      pty_backend_create_cold_1();
      goto LAB_00112590;
    }
  }
  close(pty_00->master_fd);
  noncloexec(iVar4);
  dup2(iVar4,0);
  dup2(iVar4,1);
  dup2(iVar4,2);
  close(iVar4);
  setsid();
  ioctl(0,0x540e,1);
  tcsetpgrp(0,uVar6);
  iVar4 = tcgetattr(0,&tStackY_1094);
  if (iVar4 == 0) {
    _Var3 = conf_get_bool(oldconf,0x48);
    tStackY_1094.c_cc[2] = '\b';
    if (_Var3) {
      tStackY_1094.c_cc[2] = '\x7f';
    }
    _Var3 = (*pSStackY_10a8->vt->is_utf8)(pSStackY_10a8);
    tStackY_1094.c_iflag = (uint)_Var3 << 0xe | tStackY_1094.c_iflag & 0xffffbfff;
    puVar21 = auStack_1020;
    puVar23 = auStackY_15f0;
    for (lVar10 = 0xa1; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar23 = *puVar21;
      puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
      puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
    }
    uStackY_10e8 = uStack_b18;
    copy_ttymodes_into_termios();
    tcsetattr(0,0,&tStackY_1094);
  }
  setpgid(uVar6,uVar6);
  iVar4 = open(pty_00->name,1,0);
  if (-1 < iVar4) {
    close(iVar4);
  }
LAB_00112286:
  setpgid(uVar6,uVar6);
  if (puStack_b08 != (undefined8 *)0x0) {
    pcVar13 = (char *)*puStack_b08;
    puVar21 = puStack_b08;
    while (pcVar13 != (char *)0x0) {
      puVar21 = puVar21 + 1;
      unsetenv(pcVar13);
      pcVar13 = (char *)*puVar21;
    }
  }
  if (cVar24 == '\0') {
    pcVar13 = conf_get_str(oldconf,0x35);
    pcVar13 = dupprintf("TERM=%s",pcVar13);
    putenv(pcVar13);
  }
  pcVar13 = conf_get_str_strs(oldconf,0x38,(char *)0x0,&pcStackY_10c8);
  if (pcVar13 != (char *)0x0) {
    do {
      pcVar13 = dupcat_fn(pcStackY_10c8,"=",pcVar13,0);
      putenv(pcVar13);
      pcVar13 = conf_get_str_strs(oldconf,0x38,pcStackY_10c8,&pcStackY_10c8);
    } while (pcVar13 != (char *)0x0);
  }
  if (pcStack_b10 != (char *)0x0) {
    chdir(pcStack_b10);
  }
  putty_signal(2,(_func_void_int *)0x0);
  putty_signal(3,(_func_void_int *)0x0);
  putty_signal(0xd,(_func_void_int *)0x0);
  block_signal(0xd,false);
  if (ppcStackY_10a0 == (char **)0x0 && uStackY_10b8 == 0) {
    pcVar14 = getenv("SHELL");
    pcVar13 = "/bin/sh";
    if (pcVar14 != (char *)0x0) {
      pcVar13 = pcVar14;
    }
    _Var3 = conf_get_bool(oldconf,0xc5);
    pcVar14 = pcVar13;
    if (_Var3) {
      pcVar15 = strrchr(pcVar13,0x2f);
      sVar16 = strlen(pcVar13);
      pcVar14 = (char *)safemalloc(sVar16 + 2,1,0);
      pcVar19 = pcVar15 + 1;
      if (pcVar15 == (char *)0x0) {
        pcVar19 = pcVar13;
      }
      sprintf(pcVar14,"-%s",pcVar19);
    }
    execl(pcVar13,pcVar14,0);
  }
  else {
    if (ppcStackY_10a0 != (char **)0x0) {
      execvp(*ppcStackY_10a0,ppcStackY_10a0);
    }
    if ((uStackY_10b8 != 0) && (pcVar13 = getenv("SHELL"), pcVar13 != (char *)0x0)) {
      execl(pcVar13,pcVar13,"-c",uStackY_10b8,0);
    }
  }
  perror("exec");
  _exit(0x7f);
}

Assistant:

static void pty_real_select_result(Pty *pty, int fd, int event, int status)
{
    char buf[4096];
    int ret;
    bool finished = false;

    if (event < 0) {
        /*
         * We've been called because our child process did
         * something. `status' tells us what.
         */
        if ((WIFEXITED(status) || WIFSIGNALED(status))) {
            /*
             * The primary child process died.
             */
            pty->child_dead = true;
            del234(ptys_by_pid, pty);
            pty->exit_code = status;

            /*
             * If this is an ordinary pty session, this is also the
             * moment to terminate the whole backend.
             *
             * We _could_ instead keep the terminal open for remaining
             * subprocesses to output to, but conventional wisdom
             * seems to feel that that's the Wrong Thing for an
             * xterm-alike, so we bail out now (though we don't
             * necessarily _close_ the window, depending on the state
             * of Close On Exit). This would be easy enough to change
             * or make configurable if necessary.
             */
            if (pty->master_fd >= 0)
                finished = true;
        }
    } else {
        if (event == SELECT_R) {
            bool is_stdout = (fd == pty->master_o);

            ret = read(fd, buf, sizeof(buf));

            /*
             * Treat EIO on a pty master as equivalent to EOF (because
             * that's how the kernel seems to report the event where
             * the last process connected to the other end of the pty
             * went away).
             */
            if (fd == pty->master_fd && ret < 0 && errno == EIO)
                ret = 0;

            if (ret == 0) {
                /*
                 * EOF on this input fd, so to begin with, we may as
                 * well close it, and remove all references to it in
                 * the pty's fd fields.
                 */
                uxsel_del(fd);
                close(fd);
                if (pty->master_fd == fd)
                    pty->master_fd = -1;
                if (pty->master_o == fd)
                    pty->master_o = -1;
                if (pty->master_e == fd)
                    pty->master_e = -1;

                if (is_stdout) {
                    /*
                     * We assume a clean exit if the pty (or stdout
                     * pipe) has closed, but the actual child process
                     * hasn't. The only way I can imagine this
                     * happening is if it detaches itself from the pty
                     * and goes daemonic - in which case the expected
                     * usage model would precisely _not_ be for the
                     * pterm window to hang around!
                     */
                    finished = true;
                    pty_try_wait(); /* one last effort to collect exit code */
                    if (!pty->child_dead)
                        pty->exit_code = 0;
                }
            } else if (ret < 0) {
                perror("read pty master");
                exit(1);
            } else if (ret > 0) {
                pty->output_backlog = seat_output(
                    pty->seat, !is_stdout, buf, ret);
                pty_uxsel_setup(pty);
            }
        } else if (event == SELECT_W) {
            /*
             * Attempt to send data down the pty.
             */
            pty_try_write(pty);
        }
    }

    if (finished && !pty->finished) {
        int close_on_exit;
        int i;

        for (i = 0; i < 3; i++)
            if (pty->fds[i].fd >= 0)
                uxsel_del(pty->fds[i].fd);

        pty_close(pty);

        pty->finished = true;

        /*
         * This is a slight layering-violation sort of hack: only
         * if we're not closing on exit (COE is set to Never, or to
         * Only On Clean and it wasn't a clean exit) do we output a
         * `terminated' message.
         */
        close_on_exit = conf_get_int(pty->conf, CONF_close_on_exit);
        if (close_on_exit == FORCE_OFF ||
            (close_on_exit == AUTO && pty->exit_code != 0)) {
            char *message;
            if (WIFEXITED(pty->exit_code)) {
                message = dupprintf(
                    "\r\n[pterm: process terminated with exit code %d]\r\n",
                    WEXITSTATUS(pty->exit_code));
            } else if (WIFSIGNALED(pty->exit_code)) {
#if !HAVE_STRSIGNAL
                message = dupprintf(
                    "\r\n[pterm: process terminated on signal %d]\r\n",
                    WTERMSIG(pty->exit_code));
#else
                message = dupprintf(
                    "\r\n[pterm: process terminated on signal %d (%s)]\r\n",
                    WTERMSIG(pty->exit_code),
                    strsignal(WTERMSIG(pty->exit_code)));
#endif
            } else {
                /* _Shouldn't_ happen, but if it does, a vague message
                 * is better than no message at all */
                message = dupprintf("\r\n[pterm: process terminated]\r\n");
            }
            seat_stdout_pl(pty->seat, ptrlen_from_asciz(message));
            sfree(message);
        }

        seat_eof(pty->seat);
        seat_notify_remote_exit(pty->seat);
    }
}